

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O3

int EVP_DecodeBlock(uchar *t,uchar *f,int n)

{
  uchar *puVar1;
  int iVar2;
  long lVar3;
  uchar *in;
  undefined4 in_register_00000014;
  long lVar4;
  size_t sVar5;
  long lVar6;
  size_t in_len;
  bool bVar7;
  size_t local_10;
  
  lVar4 = CONCAT44(in_register_00000014,n);
  puVar1 = f;
  if (lVar4 != 0) {
    lVar3 = -lVar4;
    in = f;
    do {
      if ((*in != '\t') && (*in != ' ')) {
        lVar6 = 0;
        goto LAB_00172a7e;
      }
      in = in + 1;
      lVar3 = lVar3 + 1;
      puVar1 = f + lVar4;
    } while (lVar3 != 0);
  }
  goto LAB_00172aa6;
  while (bVar7 = lVar3 + 1 != lVar6, puVar1 = in, lVar6 = lVar6 + -1, bVar7) {
LAB_00172a7e:
    if ((0x20 < (ulong)f[lVar6 + lVar4 + -1]) ||
       ((0x100002600U >> ((ulong)f[lVar6 + lVar4 + -1] & 0x3f) & 1) == 0)) {
      in_len = lVar6 - lVar3;
      sVar5 = 0xffffffff;
      if (((in_len & 3) != 0) || (local_10 = (in_len >> 2) * 3, 0xaaaaaaa8 < in_len))
      goto LAB_00172b33;
      goto LAB_00172ab7;
    }
  }
LAB_00172aa6:
  in = puVar1;
  local_10 = 0;
  in_len = 0;
LAB_00172ab7:
  iVar2 = EVP_DecodeBase64(t,&local_10,local_10,in,in_len);
  if (iVar2 == 0) {
    sVar5 = 0xffffffff;
  }
  else {
    sVar5 = local_10;
    if (0x5555555555555555 < local_10 * -0x5555555555555555) {
      do {
        t[sVar5] = '\0';
        sVar5 = sVar5 + 1;
      } while ((sVar5 / 3) * 3 != sVar5);
    }
    if (sVar5 >> 0x1f != 0) {
      __assert_fail("dst_len <= INT_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/base64/base64.cc"
                    ,0x1af,"int EVP_DecodeBlock(uint8_t *, const uint8_t *, size_t)");
    }
  }
LAB_00172b33:
  return (int)sVar5;
}

Assistant:

int EVP_DecodeBlock(uint8_t *dst, const uint8_t *src, size_t src_len) {
  // Trim spaces and tabs from the beginning of the input.
  while (src_len > 0) {
    if (src[0] != ' ' && src[0] != '\t') {
      break;
    }

    src++;
    src_len--;
  }

  // Trim newlines, spaces and tabs from the end of the line.
  while (src_len > 0) {
    switch (src[src_len - 1]) {
      case ' ':
      case '\t':
      case '\r':
      case '\n':
        src_len--;
        continue;
    }

    break;
  }

  size_t dst_len;
  if (!EVP_DecodedLength(&dst_len, src_len) || dst_len > INT_MAX ||
      !EVP_DecodeBase64(dst, &dst_len, dst_len, src, src_len)) {
    return -1;
  }

  // EVP_DecodeBlock does not take padding into account, so put the
  // NULs back in... so the caller can strip them back out.
  while (dst_len % 3 != 0) {
    dst[dst_len++] = '\0';
  }
  assert(dst_len <= INT_MAX);

  return (int)dst_len;
}